

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_address.cpp
# Opt level: O2

ParseDescriptorResponseStruct *
cfd::js::api::ElementsAddressStructApi::ParseDescriptor
          (ParseDescriptorResponseStruct *__return_storage_ptr__,
          ParseDescriptorRequestStruct *request)

{
  string *in_R8;
  allocator local_1f9;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  function<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&)>
  local_1d0;
  ParseDescriptorResponseStruct local_1b0;
  
  ParseDescriptorResponseStruct::ParseDescriptorResponseStruct(__return_storage_ptr__);
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1e0 = std::
              _Function_handler<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:257:20)>
              ::_M_invoke;
  local_1e8 = std::
              _Function_handler<cfd::js::api::ParseDescriptorResponseStruct_(const_cfd::js::api::ParseDescriptorRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_address.cpp:257:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_1d0,"ParseDescriptor",&local_1f9);
  ExecuteStructApi<cfd::js::api::ParseDescriptorRequestStruct,cfd::js::api::ParseDescriptorResponseStruct>
            (&local_1b0,(api *)request,(ParseDescriptorRequestStruct *)&local_1f8,&local_1d0,in_R8);
  ParseDescriptorResponseStruct::operator=(__return_storage_ptr__,&local_1b0);
  ParseDescriptorResponseStruct::~ParseDescriptorResponseStruct(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
  return __return_storage_ptr__;
}

Assistant:

ParseDescriptorResponseStruct ElementsAddressStructApi::ParseDescriptor(
    const ParseDescriptorRequestStruct& request) {
  auto call_func = [](const ParseDescriptorRequestStruct& request)
      -> ParseDescriptorResponseStruct {  // NOLINT
    NetType net_type = ConvertElementsNetType(request.network);
    ElementsAddressFactory api(net_type);
    return AddressApiBase::ParseDescriptor(request, &api);
  };

  ParseDescriptorResponseStruct result;
  result = ExecuteStructApi<
      ParseDescriptorRequestStruct, ParseDescriptorResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}